

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_freq_substraction.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Mat *this;
  char *__s;
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  arguments_t args;
  Mat image;
  Mat gauss;
  void *local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  _InputArray local_298;
  arguments_t local_280;
  string local_238 [16];
  long local_228;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [6];
  Mat local_168 [96];
  Mat local_108 [144];
  Mat local_78 [96];
  
  arguments_t::arguments_t(&local_280,argc,argv);
  sVar1 = arguments_t::parametersSize(&local_280);
  if (sVar1 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b118);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," <input> <output>",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
  }
  else {
    arguments_t::operator[][abi_cxx11_((string *)local_1d8,&local_280,0);
    cv::imread(local_238,(int)local_1d8);
    if ((Mat *)local_1d8._0_8_ != (Mat *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if (local_228 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot open ",0xc);
      arguments_t::operator[][abi_cxx11_((string *)local_1d8,&local_280,0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_1d8._0_8_,local_1d8._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((Mat *)local_1d8._0_8_ != (Mat *)(local_1d8 + 0x10)) {
        operator_delete((void *)local_1d8._0_8_);
      }
    }
    else {
      cv::Mat::clone();
      local_1c8[0]._M_allocated_capacity = 0;
      local_1d8._0_4_ = 0x1010000;
      local_298.sz.width = 0;
      local_298.sz.height = 0;
      local_298.flags = 0x2010000;
      local_298.obj = local_78;
      local_1d8._8_8_ = local_238;
      cv::medianBlur((_InputArray *)local_1d8,(_OutputArray *)&local_298,7);
      cv::operator-((Mat *)local_1d8,(Mat *)local_238);
      (**(code **)(*(long *)local_1d8._0_8_ + 0x18))(local_1d8._0_8_,local_1d8,local_238,0xffffffff)
      ;
      cv::Mat::~Mat(local_108);
      cv::Mat::~Mat(local_168);
      this = (Mat *)(local_1d8 + 0x10);
      cv::Mat::~Mat(this);
      local_1d8._0_8_ = this;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"result","");
      local_298.sz.width = 0;
      local_298.sz.height = 0;
      local_298.flags = 0x1010000;
      local_298.obj = local_78;
      cv::imshow((string *)local_1d8,&local_298);
      if ((Mat *)local_1d8._0_8_ != this) {
        operator_delete((void *)local_1d8._0_8_);
      }
      cv::waitKey(0);
      arguments_t::operator[][abi_cxx11_((string *)local_1d8,&local_280,1);
      local_298.sz.width = 0;
      local_298.sz.height = 0;
      local_298.flags = 0x1010000;
      local_2a8 = 0;
      local_2b8 = (void *)0x0;
      uStack_2b0 = 0;
      local_298.obj = local_238;
      cv::imwrite((string *)local_1d8,&local_298,(vector *)&local_2b8);
      if (local_2b8 != (void *)0x0) {
        operator_delete(local_2b8);
      }
      if ((Mat *)local_1d8._0_8_ != this) {
        operator_delete((void *)local_1d8._0_8_);
      }
      cv::Mat::~Mat(local_78);
    }
    cv::Mat::~Mat((Mat *)local_238);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280.parameters);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_280);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    arguments_t args(argc, argv);
    if (args.parametersSize() < 2) {
        std::cout << "usage: " << argv[0] << " <input> <output>" << std::endl;
        return 0;
    }

    cv::Mat image = cv::imread(args[0], cv::IMREAD_GRAYSCALE);
    if (!image.data) {
        std::cout << "Cannot open " << args[0] << std::endl;
        return 0;
    }

    auto gauss = image.clone();
    cv::medianBlur(image, gauss, 7);
    image = image - gauss;
    //cv::equalizeHist(image, image);

    cv::imshow("result", gauss);
    cv::waitKey();

    cv::imwrite(args[1], image);
    return 0;
}